

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

int TIFFGrowStrips(TIFF *tif,uint32_t delta,char *module)

{
  uint32_t *puVar1;
  uint64_t *p;
  uint64_t *p_00;
  int iVar2;
  undefined4 in_register_00000034;
  
  if ((tif->tif_dir).td_planarconfig == 1) {
    p = (uint64_t *)
        _TIFFreallocExt(tif,(tif->tif_dir).td_stripoffset_p,
                        (ulong)((tif->tif_dir).td_nstrips + 1) << 3);
    p_00 = (uint64_t *)
           _TIFFreallocExt(tif,(tif->tif_dir).td_stripbytecount_p,
                           (ulong)((tif->tif_dir).td_nstrips + 1) << 3);
    if ((p == (uint64_t *)0x0) || (p_00 == (uint64_t *)0x0)) {
      if (p != (uint64_t *)0x0) {
        _TIFFfreeExt(tif,p);
      }
      if (p_00 != (uint64_t *)0x0) {
        _TIFFfreeExt(tif,p_00);
      }
      (tif->tif_dir).td_nstrips = 0;
      iVar2 = 0;
      TIFFErrorExtR(tif,(char *)CONCAT44(in_register_00000034,delta),
                    "No space to expand strip arrays");
    }
    else {
      (tif->tif_dir).td_stripoffset_p = p;
      (tif->tif_dir).td_stripbytecount_p = p_00;
      _TIFFmemset(p + (tif->tif_dir).td_nstrips,0,8);
      _TIFFmemset((tif->tif_dir).td_stripbytecount_p + (tif->tif_dir).td_nstrips,0,8);
      puVar1 = &(tif->tif_dir).td_nstrips;
      *puVar1 = *puVar1 + 1;
      *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 8;
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("td->td_planarconfig == PLANARCONFIG_CONTIG",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_write.c"
                ,0x2d8,"int TIFFGrowStrips(TIFF *, uint32_t, const char *)");
}

Assistant:

static int TIFFGrowStrips(TIFF *tif, uint32_t delta, const char *module)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t *new_stripoffset;
    uint64_t *new_stripbytecount;

    assert(td->td_planarconfig == PLANARCONFIG_CONTIG);
    new_stripoffset = (uint64_t *)_TIFFreallocExt(
        tif, td->td_stripoffset_p, (td->td_nstrips + delta) * sizeof(uint64_t));
    new_stripbytecount = (uint64_t *)_TIFFreallocExt(
        tif, td->td_stripbytecount_p,
        (td->td_nstrips + delta) * sizeof(uint64_t));
    if (new_stripoffset == NULL || new_stripbytecount == NULL)
    {
        if (new_stripoffset)
            _TIFFfreeExt(tif, new_stripoffset);
        if (new_stripbytecount)
            _TIFFfreeExt(tif, new_stripbytecount);
        td->td_nstrips = 0;
        TIFFErrorExtR(tif, module, "No space to expand strip arrays");
        return (0);
    }
    td->td_stripoffset_p = new_stripoffset;
    td->td_stripbytecount_p = new_stripbytecount;
    _TIFFmemset(td->td_stripoffset_p + td->td_nstrips, 0,
                delta * sizeof(uint64_t));
    _TIFFmemset(td->td_stripbytecount_p + td->td_nstrips, 0,
                delta * sizeof(uint64_t));
    td->td_nstrips += delta;
    tif->tif_flags |= TIFF_DIRTYDIRECT;

    return (1);
}